

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCompare(Parse *pParse,Expr *pA,Expr *pB,int iTab)

{
  u32 *puVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  char *__s1;
  sqlite3_value *v;
  byte bVar5;
  int iVar6;
  uint uVar7;
  sqlite3_value *pVal;
  u8 aff;
  uint uVar8;
  ValueNewStat4Ctx *in_R9;
  sqlite3_value *local_38;
  
  if (pA == (Expr *)0x0 || pB == (Expr *)0x0) {
    return (uint)(pB != pA) * 2;
  }
  if ((pParse != (Parse *)0x0) && (pA->op == 0x87)) {
    local_38 = (Mem *)0x0;
    valueFromExpr(pParse->db,pB,'\x01','A',&local_38,in_R9);
    v = local_38;
    if (local_38 != (Mem *)0x0) {
      sVar3 = pA->iColumn;
      uVar7 = 0x80000000;
      if (sVar3 < 0x20) {
        uVar7 = 1 << ((char)sVar3 - 1U & 0x1f);
      }
      puVar1 = &pParse->pVdbe->expmask;
      *puVar1 = *puVar1 | uVar7;
      pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar3,aff);
      if (pVal == (sqlite3_value *)0x0) {
        sqlite3ValueFree(v);
      }
      else {
        if ((pVal->flags & 0xf) == 2) {
          sqlite3ValueText(pVal,'\x01');
        }
        iVar6 = sqlite3MemCompare(pVal,v,(CollSeq *)0x0);
        sqlite3ValueFree(v);
        sqlite3ValueFree(pVal);
        if (iVar6 == 0) {
          return 0;
        }
      }
    }
  }
  uVar7 = pA->flags;
  uVar4 = pB->flags;
  uVar8 = uVar4 | uVar7;
  if ((uVar8 >> 10 & 1) == 0) {
    bVar2 = pA->op;
    bVar5 = pB->op;
    if (bVar2 == bVar5) {
      if (((bVar2 | 2) != 0x9a) && (__s1 = (pA->u).zToken, __s1 != (char *)0x0)) {
        if (bVar2 == 0x97) {
          iVar6 = sqlite3StrICmp(__s1,(pB->u).zToken);
          if (iVar6 != 0) {
            return 2;
          }
        }
        else {
          iVar6 = strcmp(__s1,(pB->u).zToken);
          if (iVar6 != 0) {
            return (bVar2 != 0x5e) + 1;
          }
        }
      }
      if (((uVar4 ^ uVar7) & 0x10) != 0) {
        return 2;
      }
      if ((uVar8 >> 0xe & 1) == 0) {
        if ((uVar8 >> 0xb & 1) != 0) {
          return 2;
        }
        iVar6 = sqlite3ExprCompare(pParse,pA->pLeft,pB->pLeft,iTab);
        if (iVar6 != 0) {
          return 2;
        }
        iVar6 = sqlite3ExprCompare(pParse,pA->pRight,pB->pRight,iTab);
        if (iVar6 != 0) {
          return 2;
        }
        iVar6 = sqlite3ExprListCompare((pA->x).pList,(pB->x).pList,iTab);
        if (iVar6 != 0) {
          return 2;
        }
        if (((uVar8 >> 0xd & 1) == 0) && (pA->op != 'a')) {
          if (pA->iColumn != pB->iColumn) {
            return 2;
          }
          if ((pA->iTable != pB->iTable) && (-1 < pB->iTable || pA->iTable != iTab)) {
            return 2;
          }
        }
      }
      return 0;
    }
    if (bVar2 == 0x5e) {
      uVar7 = sqlite3ExprCompare(pParse,pA->pLeft,pB,iTab);
      if (uVar7 < 2) {
        return 1;
      }
      bVar5 = pB->op;
    }
    if ((bVar5 == 0x5e) && (uVar7 = sqlite3ExprCompare(pParse,pA,pB->pLeft,iTab), uVar7 < 2)) {
      return 1;
    }
  }
  else if ((((uVar7 & uVar4) >> 10 & 1) != 0) && ((pA->u).iValue == (pB->u).iValue)) {
    return 0;
  }
  return 2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompare(Parse *pParse, Expr *pA, Expr *pB, int iTab){
  u32 combinedFlags;
  if( pA==0 || pB==0 ){
    return pB==pA ? 0 : 2;
  }
  if( pParse && pA->op==TK_VARIABLE && exprCompareVariable(pParse, pA, pB) ){
    return 0;
  }
  combinedFlags = pA->flags | pB->flags;
  if( combinedFlags & EP_IntValue ){
    if( (pA->flags&pB->flags&EP_IntValue)!=0 && pA->u.iValue==pB->u.iValue ){
      return 0;
    }
    return 2;
  }
  if( pA->op!=pB->op ){
    if( pA->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA->pLeft,pB,iTab)<2 ){
      return 1;
    }
    if( pB->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA,pB->pLeft,iTab)<2 ){
      return 1;
    }
    return 2;
  }
  if( pA->op!=TK_COLUMN && pA->op!=TK_AGG_COLUMN && pA->u.zToken ){
    if( pA->op==TK_FUNCTION ){
      if( sqlite3StrICmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
    }else if( strcmp(pA->u.zToken,pB->u.zToken)!=0 ){
      return pA->op==TK_COLLATE ? 1 : 2;
    }
  }
  if( (pA->flags & EP_Distinct)!=(pB->flags & EP_Distinct) ) return 2;
  if( ALWAYS((combinedFlags & EP_TokenOnly)==0) ){
    if( combinedFlags & EP_xIsSelect ) return 2;
    if( sqlite3ExprCompare(pParse, pA->pLeft, pB->pLeft, iTab) ) return 2;
    if( sqlite3ExprCompare(pParse, pA->pRight, pB->pRight, iTab) ) return 2;
    if( sqlite3ExprListCompare(pA->x.pList, pB->x.pList, iTab) ) return 2;
    if( ALWAYS((combinedFlags & EP_Reduced)==0) && pA->op!=TK_STRING ){
      if( pA->iColumn!=pB->iColumn ) return 2;
      if( pA->iTable!=pB->iTable 
       && (pA->iTable!=iTab || NEVER(pB->iTable>=0)) ) return 2;
    }
  }
  return 0;
}